

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

int google::protobuf::internal::TcParser::FieldNumber(TcParseTableBase *table,FieldEntry *entry)

{
  _Optional_base<int,_true,_true> _Var1;
  int base_field_number;
  uint uVar2;
  ushort *puVar3;
  bool bVar4;
  anon_class_8_1_c08dfc18 visit_bitmap;
  size_t need_to_skip;
  
  need_to_skip = (long)((long)entry -
                       ((long)&table->has_bits_offset + (ulong)table->field_entries_offset)) / 0xc;
  visit_bitmap.need_to_skip = &need_to_skip;
  _Var1._M_payload.super__Optional_payload_base<int> =
       (_Optional_payload<int,_true,_true,_true>)
       FieldNumber::anon_class_8_1_c08dfc18::operator()(&visit_bitmap,~table->skipmap32,1);
  if (((ulong)_Var1._M_payload.super__Optional_payload_base<int> >> 0x20 & 1) == 0) {
    puVar3 = (ushort *)((long)&table->has_bits_offset + (ulong)table->lookup_table_offset);
    do {
      base_field_number = *(int *)puVar3;
      if ((puVar3[1] & *puVar3) == 0xffff) {
        Unreachable("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_lite.cc"
                    ,0x17c);
      }
      uVar2 = (uint)puVar3[2];
      puVar3 = puVar3 + 3;
      while (bVar4 = uVar2 != 0, uVar2 = uVar2 - 1, bVar4) {
        _Var1._M_payload.super__Optional_payload_base<int> =
             (_Optional_payload<int,_true,_true,_true>)
             FieldNumber::anon_class_8_1_c08dfc18::operator()
                       (&visit_bitmap,*puVar3 ^ 0xffff,base_field_number);
        if (((ulong)_Var1._M_payload.super__Optional_payload_base<int> & 0x100000000) != 0)
        goto LAB_001dba2e;
        puVar3 = puVar3 + 2;
        base_field_number = base_field_number + 0x10;
      }
    } while( true );
  }
LAB_001dba2e:
  return _Var1._M_payload.super__Optional_payload_base<int>._M_payload;
}

Assistant:

int TcParser::FieldNumber(const TcParseTableBase* table,
                          const TcParseTableBase::FieldEntry* entry) {
  // The data structure was not designed to be queried in this direction, so
  // we have to do a linear search over the entries to see which one matches
  // while keeping track of the field number.
  // But it is fine because we are only using this for debug check messages.
  size_t need_to_skip = entry - table->field_entries_begin();
  const auto visit_bitmap = [&](uint32_t field_bitmap,
                                int base_field_number) -> absl::optional<int> {
    for (; field_bitmap != 0; field_bitmap &= field_bitmap - 1) {
      if (need_to_skip == 0) {
        return absl::countr_zero(field_bitmap) + base_field_number;
      }
      --need_to_skip;
    }
    return absl::nullopt;
  };
  if (auto number = visit_bitmap(~table->skipmap32, 1)) {
    return *number;
  }

  for (const uint16_t* lookup_table = table->field_lookup_begin();
       lookup_table[0] != 0xFFFF || lookup_table[1] != 0xFFFF;) {
    uint32_t fstart = lookup_table[0] | (lookup_table[1] << 16);
    lookup_table += 2;
    const uint16_t num_skip_entries = *lookup_table++;
    for (uint16_t i = 0; i < num_skip_entries; ++i) {
      // for each group of 16 fields we have: a
      // bitmap of 16 bits a 16-bit field-entry
      // offset for the first of them.
      if (auto number = visit_bitmap(static_cast<uint16_t>(~*lookup_table),
                                     fstart + 16 * i)) {
        return *number;
      }
      lookup_table += 2;
    }
  }
  Unreachable();
}